

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

string * __thiscall OpenMD::ZConsVisitor::toString_abi_cxx11_(ZConsVisitor *this)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  pointer ppVar5;
  long in_RSI;
  string *in_RDI;
  int j;
  iterator i;
  char buffer [65535];
  string *result;
  map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  *in_stack_fffffffffffeff48;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>
  *in_stack_fffffffffffeff50;
  char *__s;
  _Self _Stack_10050;
  _Base_ptr p_Stack_10048;
  uint uStack_1003c;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> a_Stack_10038 [3];
  undefined1 uStack_10019;
  char acStack_10018 [65560];
  
  uStack_10019 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  snprintf(acStack_10018,0xffff,
           "------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",uVar3);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  sVar4 = std::
          map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
          ::size((map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
                  *)0x35404f);
  snprintf(acStack_10018,0xffff,"number of zconstraint molecule: %d\n",sVar4 & 0xffffffff);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"zconstraint tolerance = %lf\n",*(undefined8 *)(in_RSI + 0x70));
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"zconstraint sample time = %lf\n",*(undefined8 *)(in_RSI + 0x78));
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"zconstraint output filename = %s\n",uVar3);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::_Rb_tree_iterator
            (a_Stack_10038);
  uStack_1003c = 0;
  p_Stack_10048 =
       (_Base_ptr)
       std::
       map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
       ::begin(in_stack_fffffffffffeff48);
  a_Stack_10038[0]._M_node = p_Stack_10048;
  while( true ) {
    _Stack_10050._M_node =
         (_Base_ptr)
         std::
         map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
         ::end(in_stack_fffffffffffeff48);
    bVar2 = std::operator!=(a_Stack_10038,&_Stack_10050);
    uVar1 = uStack_1003c;
    if (!bVar2) break;
    uStack_1003c = uStack_1003c + 1;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>
                         *)0x3541b8);
    snprintf(acStack_10018,0xffff,"zconstraint molecule[%d] = %d\n",(ulong)uVar1,
             (ulong)(uint)ppVar5->first);
    std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::operator++
              (in_stack_fffffffffffeff50);
  }
  __s = acStack_10018;
  snprintf(__s,0xffff,"------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,__s);
  return in_RDI;
}

Assistant:

const std::string ZConsVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(buffer, 65535, "number of zconstraint molecule: %d\n",
             (int)zmolStates_.size());
    result += buffer;

    snprintf(buffer, 65535, "zconstraint tolerance = %lf\n", zconsTol_);
    result += buffer;

    snprintf(buffer, 65535, "zconstraint sample time = %lf\n", zconsTime_);
    result += buffer;

    snprintf(buffer, 65535, "zconstraint output filename = %s\n",
             zconsFilename_.c_str());
    result += buffer;

    std::map<int, ZConsState>::iterator i;
    int j = 0;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      snprintf(buffer, 65535, "zconstraint molecule[%d] = %d\n", j++, i->first);
      result += buffer;
    }

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }